

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageFieldLiteGenerator::GenerateMembers
          (ImmutableMessageFieldLiteGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view end_varname;
  string_view end_varname_00;
  Options local_1b8;
  Options local_168;
  Options local_118;
  Options local_c8;
  Options local_78;
  
  vars = &this->variables_;
  text._M_str = "private $type$ $name$_;\n";
  text._M_len = 0x18;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text);
  PrintExtraFieldInfo(vars,printer);
  pFVar1 = this->descriptor_;
  Options::Options(&local_78,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar1,&local_78,false);
  Options::~Options(&local_78);
  text_00._M_str =
       "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $is_field_present_message$;\n}\n"
  ;
  text_00._M_len = 0x77;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_00);
  begin_varname._M_str = "{";
  begin_varname._M_len = 1;
  end_varname._M_str = "}";
  end_varname._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname,end_varname,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  Options::Options(&local_c8,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar1,&local_c8,false);
  Options::~Options(&local_c8);
  text_01._M_str =
       "@java.lang.Override\n$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n  return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n}\n"
  ;
  text_01._M_len = 0x93;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_01);
  begin_varname_00._M_str = "{";
  begin_varname_00._M_len = 1;
  end_varname_00._M_str = "}";
  end_varname_00._M_len = 1;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,begin_varname_00,end_varname_00,this->descriptor_,
             (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
  pFVar1 = this->descriptor_;
  Options::Options(&local_118,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar1,&local_118,false);
  Options::~Options(&local_118);
  text_02._M_str =
       "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\nprivate void set$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  $name$_ = value;\n  $set_has_field_bit_message$\n}\n"
  ;
  text_02._M_len = 0xcc;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_02);
  pFVar1 = this->descriptor_;
  Options::Options(&local_168,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar1,&local_168,false);
  Options::~Options(&local_168);
  text_03._M_str =
       "@java.lang.SuppressWarnings({\"ReferenceEquality\", \"ReturnValueIgnored\"})\nprivate void merge$capitalized_name$($type$ value) {\n  value.getClass();  // minimal bytecode null check\n  if ($name$_ != null &&\n      $name$_ != $type$.getDefaultInstance()) {\n    $name$_ =\n      $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n  } else {\n    $name$_ = value;\n  }\n  $set_has_field_bit_message$\n}\n"
  ;
  text_03._M_len = 399;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_03);
  pFVar1 = this->descriptor_;
  Options::Options(&local_1b8,&this->context_->options_);
  WriteFieldDocComment(printer,pFVar1,&local_1b8,false);
  Options::~Options(&local_1b8);
  text_04._M_str =
       "private void clear$capitalized_name$() {\n  $name$_ = null;\n  $clear_has_field_bit_message$\n}\n"
  ;
  text_04._M_len = 0x5d;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,text_04);
  return;
}

Assistant:

void ImmutableMessageFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {

  printer->Print(variables_, "private $type$ $name$_;\n");
  PrintExtraFieldInfo(variables_, printer);

  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $is_field_present_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$() {\n"
      "  return $name$_ == null ? $type$.getDefaultInstance() : $name$_;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  // Field.Builder setField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.SuppressWarnings(\"ReturnValueIgnored\")\n"
                 "private void set$capitalized_name$($type$ value) {\n"
                 "  value.getClass();  // minimal bytecode null check\n"
                 "  $name$_ = value;\n"
                 "  $set_has_field_bit_message$\n"
                 "}\n");

  // Field.Builder mergeField(Field value)
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(
      variables_,
      "@java.lang.SuppressWarnings({\"ReferenceEquality\", "
      "\"ReturnValueIgnored\"})\n"
      "private void merge$capitalized_name$($type$ value) {\n"
      "  value.getClass();  // minimal bytecode null check\n"
      "  if ($name$_ != null &&\n"
      "      $name$_ != $type$.getDefaultInstance()) {\n"
      "    $name$_ =\n"
      "      $type$.newBuilder($name$_).mergeFrom(value).buildPartial();\n"
      "  } else {\n"
      "    $name$_ = value;\n"
      "  }\n"
      "  $set_has_field_bit_message$\n"
      "}\n");

  // Field.Builder clearField()
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "private void clear$capitalized_name$() {\n"
                 "  $name$_ = null;\n"
                 "  $clear_has_field_bit_message$\n"
                 "}\n");
}